

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

void nullcThrowError(char *error,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char buf [1024];
  undefined8 local_4d8;
  void **local_4d0;
  undefined1 *local_4c8;
  undefined1 local_4b8 [8];
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  undefined8 local_418;
  char local_408 [1023];
  undefined1 local_9;
  
  if (in_AL != '\0') {
    local_488 = in_XMM0_Qa;
    local_478 = in_XMM1_Qa;
    local_468 = in_XMM2_Qa;
    local_458 = in_XMM3_Qa;
    local_448 = in_XMM4_Qa;
    local_438 = in_XMM5_Qa;
    local_428 = in_XMM6_Qa;
    local_418 = in_XMM7_Qa;
  }
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    local_4c8 = local_4b8;
    local_4d0 = &args[0].overflow_arg_area;
    local_4d8 = 0x3000000008;
    local_4b0 = in_RSI;
    local_4a8 = in_RDX;
    local_4a0 = in_RCX;
    local_498 = in_R8;
    local_490 = in_R9;
    if (error == (char *)0x0) {
      local_408[0] = '\0';
    }
    else {
      vsnprintf(local_408,0x400,error,&local_4d8);
    }
    local_9 = 0;
    if (NULLC::currExec == 0) {
      ExecutorRegVm::Stop(NULLC::executorRegVm,local_408);
    }
    else if (NULLC::currExec == 1) {
      ExecutorX86::Stop(NULLC::executorX86,local_408);
    }
  }
  return;
}

Assistant:

void nullcThrowError(const char* error, ...)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED((void)0);

	va_list args;
	va_start(args, error);

	char buf[1024];

	if(error)
		vsnprintf(buf, 1024, error, args);
	else
		buf[0] = 0;
	buf[1024 - 1] = '\0';

	va_end(args);

	if(currExec == NULLC_X86)
	{
#ifdef NULLC_BUILD_X86_JIT
		executorX86->Stop(buf);
#endif
	}
	else if(currExec == NULLC_REG_VM)
	{
		executorRegVm->Stop(buf);
	}
	else if(currExec == NULLC_LLVM)
	{
#ifdef NULLC_LLVM_SUPPORT
		executorLLVM->Stop(buf);
#endif
	}
}